

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout>::
runThread(CreateThread<vkt::api::(anonymous_namespace)::DescriptorSetLayout> *this)

{
  Environment *pEVar1;
  pointer pVVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  VkDescriptorSetLayoutCreateInfo local_98;
  deUint64 local_78;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)19>_> local_50;
  
  bVar5 = 0;
  iVar4 = 0;
  do {
    if ((byte)((bVar5 / 5 & 0xfc) * -5) == (char)iVar4) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    pEVar1 = this->m_env;
    pVVar2 = (this->m_resources->bindings).
             super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    local_98.pNext = (void *)0x0;
    uVar3 = (long)(this->m_resources->bindings).
                  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
    local_98.pBindings = (pointer)0x0;
    if (uVar3 != 0) {
      local_98.pBindings = pVVar2;
    }
    local_98.flags = 0;
    local_98.bindingCount = (int)(uVar3 >> 3) * -0x55555555;
    ::vk::createDescriptorSetLayout
              (&local_50,pEVar1->vkd,pEVar1->device,&local_98,pEVar1->allocationCallbacks);
    local_78 = local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
    DStack_70.m_deviceIface =
         local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
    DStack_70.m_device =
         local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
    DStack_70.m_allocator =
         local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
    if (local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&DStack_70,
                 (VkDescriptorSetLayout)
                 local_50.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
    iVar4 = iVar4 + -1;
    bVar5 = bVar5 + 1;
  } while (iVar4 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}